

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

double __thiscall SimpleConfiguration::deltaF(SimpleConfiguration *this,int n)

{
  pointer pdVar1;
  double in_RAX;
  int n_00;
  double local_28;
  
  local_28 = in_RAX;
  while (this->nCounter <= n) {
    n_00 = this->nCounter + 1;
    this->nCounter = n_00;
    local_28 = fFunc(this,n_00);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->fVal,&local_28);
  }
  pdVar1 = (this->fVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  return pdVar1[(long)n + 1] - pdVar1[n];
}

Assistant:

double deltaF(int n) {
        // fVal[n + 1] - f[n]
        while (nCounter < n + 1) {
            ++nCounter; fVal.push_back(fFunc(nCounter));
        }
        return fVal[n + 1] - fVal[n];
    }